

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O2

void RecalculateDrawnSubsectors(void)

{
  long lVar1;
  subsector_t *psVar2;
  int i;
  long lVar3;
  long lVar4;
  uint j;
  ulong uVar5;
  
  psVar2 = subsectors;
  for (lVar3 = 0; lVar3 < numsubsectors; lVar3 = lVar3 + 1) {
    lVar4 = 0x18;
    for (uVar5 = 0; uVar5 < psVar2[lVar3].numlines; uVar5 = uVar5 + 1) {
      lVar1 = *(long *)((long)&(psVar2[lVar3].firstline)->v1 + lVar4);
      if ((lVar1 != 0) && ((*(byte *)(lVar1 + 0x21) & 1) != 0)) {
        *(byte *)&psVar2[lVar3].flags = (byte)psVar2[lVar3].flags | 2;
      }
      lVar4 = lVar4 + 0x30;
    }
  }
  return;
}

Assistant:

void RecalculateDrawnSubsectors()
{
	for (int i = 0; i<numsubsectors; i++)
	{
		subsector_t *sub = &subsectors[i];
		for (unsigned int j = 0; j<sub->numlines; j++)
		{
			if (sub->firstline[j].linedef != NULL &&
				(sub->firstline[j].linedef->flags & ML_MAPPED))
			{
				sub->flags |= SSECF_DRAWN;
			}
		}
	}
}